

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::WaitForSinks(LogMessageData *data)

{
  reference ppLVar1;
  size_type __n;
  
  ::glog_internal_namespace_::Mutex::ReaderLock((Mutex *)sink_mutex_);
  if (sinks_ != (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0) {
    __n = (long)(sinks_->super_vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>).
                super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(sinks_->super_vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>).
                super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
    while (__n = __n - 1, __n != 0xffffffffffffffff) {
      ppLVar1 = std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::
                operator[](sinks_,__n);
      (*(*ppLVar1)->_vptr_LogSink[4])();
    }
  }
  if ((((code *)data->send_method_ == LogMessage::SendToSink ||
        (code *)data->send_method_ == LogMessage::SendToSinkAndLog) &&
      (*(long *)&data->field_0x76a8 == 0)) &&
     ((data->field_6).outvec_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0)) {
    (*(code *)(((data->field_6).outvec_)->
              super__Safe_container<std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_debug::_Safe_sequence,_true>
              ).
              super__Safe_sequence<std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .super__Safe_sequence_base._M_iterators[1]._M_sequence)();
  }
  ::glog_internal_namespace_::Mutex::ReaderUnlock((Mutex *)sink_mutex_);
  return;
}

Assistant:

inline void LogDestination::WaitForSinks(LogMessage::LogMessageData* data) {
  ReaderMutexLock l(&sink_mutex_);
  if (sinks_) {
    for (size_t i = sinks_->size(); i-- > 0; ) {
      (*sinks_)[i]->WaitTillSent();
    }
  }
  const bool send_to_sink =
      (data->send_method_ == &LogMessage::SendToSink) ||
      (data->send_method_ == &LogMessage::SendToSinkAndLog);
  if (send_to_sink && data->sink_ != NULL) {
    data->sink_->WaitTillSent();
  }
}